

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdgl.cpp
# Opt level: O2

void rw::wdgl::packattrib(uint8 *dst,float32 *src,AttribDesc *a,float32 scale)

{
  int i;
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  float32 fVar4;
  
  switch(a->type) {
  case 0:
    memcpy(dst,src,(long)a->size << 2);
    return;
  case 1:
    for (lVar2 = 0; lVar2 < a->size; lVar2 = lVar2 + 1) {
      fVar4 = scale;
      if (a->normalized != 0) {
        fVar4 = 127.0;
      }
      dst[lVar2] = (uint8)(int)((float)fVar4 * (float)src[lVar2]);
    }
    break;
  case 2:
    for (lVar2 = 0; lVar2 < a->size; lVar2 = lVar2 + 1) {
      fVar4 = scale;
      if (a->normalized != 0) {
        fVar4 = 255.0;
      }
      dst[lVar2] = (uint8)(int)((float)fVar4 * (float)src[lVar2]);
    }
    break;
  case 3:
    uVar3 = 0;
    uVar1 = (ulong)(uint)a->size;
    if (a->size < 1) {
      uVar1 = uVar3;
    }
    for (; uVar1 != uVar3; uVar3 = uVar3 + 1) {
      fVar4 = scale;
      if (a->normalized != 0) {
        fVar4 = 32767.0;
      }
      *(short *)(dst + uVar3 * 2) = (short)(int)((float)fVar4 * (float)src[uVar3]);
    }
    break;
  case 4:
    uVar3 = 0;
    uVar1 = (ulong)(uint)a->size;
    if (a->size < 1) {
      uVar1 = uVar3;
    }
    for (; uVar1 != uVar3; uVar3 = uVar3 + 1) {
      fVar4 = scale;
      if (a->normalized != 0) {
        fVar4 = 65535.0;
      }
      *(short *)(dst + uVar3 * 2) = (short)(int)((float)fVar4 * (float)src[uVar3]);
    }
  }
  return;
}

Assistant:

void
packattrib(uint8 *dst, float32 *src, AttribDesc *a, float32 scale=1.0f)
{
	int8 *i8dst;
	uint16 *u16dst;
	int16 *i16dst;

	switch(a->type){
	case 0:	// float
		memcpy(dst, src, a->size*4);
		break;

	// TODO: maybe have loop inside if?
	case 1: // byte
		i8dst = (int8*)dst;
		for(int i = 0; i < a->size; i++){
			if(!a->normalized)
				i8dst[i] = src[i]*scale;
			else
				i8dst[i] = src[i]*127.0f;
		}
		break;

	case 2: // ubyte
		for(int i = 0; i < a->size; i++){
			if(!a->normalized)
				dst[i] = src[i]*scale;
			else
				dst[i] = src[i]*255.0f;
		}
		break;

	case 3: // short
		i16dst = (int16*)dst;
		for(int i = 0; i < a->size; i++){
			if(!a->normalized)
				i16dst[i] = src[i]*scale;
			else
				i16dst[i] = src[i]*32767.0f;
		}
		break;

	case 4: // ushort
		u16dst = (uint16*)dst;
		for(int i = 0; i < a->size; i++){
			if(!a->normalized)
				u16dst[i] = src[i]*scale;
			else
				u16dst[i] = src[i]*65535.0f;
		}
		break;
	}
}